

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::TestFactoryImpl<bioparser::test::BioparserSamTest_CompressedParseInChunks_Test>::
CreateTest(TestFactoryImpl<bioparser::test::BioparserSamTest_CompressedParseInChunks_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x30);
  bioparser::test::BioparserSamTest_CompressedParseInChunks_Test::
  BioparserSamTest_CompressedParseInChunks_Test
            ((BioparserSamTest_CompressedParseInChunks_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }